

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_node<_IO_FILE*,int,unsigned_int>
               (SingleTreeIndex *node,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  bool *pbVar1;
  size_t vec_size;
  bool *local_38;
  
  if (!interrupt_switch) {
    local_38 = &interrupt_switch;
    read_bytes<unsigned_long,unsigned_int>(&local_38,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>
              (&node->terminal_node_mappings,(size_t)local_38,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>(&local_38,1,in,buffer,diff_endian);
    pbVar1 = local_38;
    read_bytes<double>(&node->node_distances,(size_t)local_38,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,(size_t)pbVar1);
    }
    read_bytes<unsigned_long,unsigned_int>(&local_38,1,in,buffer,diff_endian);
    pbVar1 = local_38;
    read_bytes<double>(&node->node_depths,(size_t)local_38,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->node_depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,(size_t)pbVar1);
    }
    read_bytes<unsigned_long,unsigned_int>(&local_38,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>
              (&node->reference_points,(size_t)local_38,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>(&local_38,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>
              (&node->reference_indptr,(size_t)local_38,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>(&local_38,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>
              (&node->reference_mapping,(size_t)local_38,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_int>(&node->n_terminal,1,in,buffer,diff_endian);
  }
  return;
}

Assistant:

void deserialize_node(SingleTreeIndex &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.terminal_node_mappings, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_distances, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_depths, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_points, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_indptr, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_mapping, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&node.n_terminal, (size_t)1, in, buffer, diff_endian);
}